

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

longdouble * __thiscall PrimitiveTestClass::FillValues<long_double*>(PrimitiveTestClass *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  longdouble *plVar3;
  ulong local_20;
  size_t i;
  longdouble *ret;
  PrimitiveTestClass *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->SIZE;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  plVar3 = (longdouble *)operator_new__(uVar2);
  for (local_20 = 0; local_20 < (ulong)(long)this->SIZE; local_20 = local_20 + 1) {
    plVar3[local_20] = (longdouble)255.0;
  }
  return plVar3;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }